

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaGrammar.cpp
# Opt level: O0

XMLElementDecl * __thiscall
xercesc_4_0::SchemaGrammar::putElemDecl
          (SchemaGrammar *this,uint uriId,XMLCh *baseName,XMLCh *prefixName,XMLCh *param_4,
          uint scope,bool notDeclared)

{
  SchemaElementDecl *this_00;
  RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *pRVar1;
  XMLCh *pXVar2;
  XMLSize_t XVar3;
  SchemaElementDecl *retVal;
  bool notDeclared_local;
  uint scope_local;
  XMLCh *param_4_local;
  XMLCh *prefixName_local;
  XMLCh *baseName_local;
  uint uriId_local;
  SchemaGrammar *this_local;
  
  this_00 = (SchemaElementDecl *)XMemory::operator_new(0x80,this->fMemoryManager);
  SchemaElementDecl::SchemaElementDecl
            (this_00,prefixName,baseName,uriId,Any,0xfffffffe,this->fMemoryManager);
  if (notDeclared) {
    if (this->fElemNonDeclPool ==
        (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)0x0) {
      pRVar1 = (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)
               XMemory::operator_new(0x40,this->fMemoryManager);
      RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
      RefHash3KeysIdPool(pRVar1,0x1d,true,0x80,this->fMemoryManager);
      this->fElemNonDeclPool = pRVar1;
    }
    pRVar1 = this->fElemNonDeclPool;
    pXVar2 = XMLElementDecl::getBaseName((XMLElementDecl *)this_00);
    XVar3 = RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::put
                      (pRVar1,pXVar2,uriId,scope,this_00);
    XMLElementDecl::setId((XMLElementDecl *)this_00,XVar3);
  }
  else {
    pRVar1 = this->fElemDeclPool;
    pXVar2 = XMLElementDecl::getBaseName((XMLElementDecl *)this_00);
    XVar3 = RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::put
                      (pRVar1,pXVar2,uriId,scope,this_00);
    XMLElementDecl::setId((XMLElementDecl *)this_00,XVar3);
  }
  return &this_00->super_XMLElementDecl;
}

Assistant:

XMLElementDecl* SchemaGrammar::putElemDecl (const   unsigned int    uriId
        , const XMLCh* const    baseName
        , const XMLCh* const    prefixName
        , const XMLCh* const
        , unsigned int          scope
        , const bool            notDeclared)
{
    SchemaElementDecl* retVal = new (fMemoryManager) SchemaElementDecl
    (
        prefixName
        , baseName
        , uriId
        , SchemaElementDecl::Any
        , Grammar::TOP_LEVEL_SCOPE
        , fMemoryManager
    );
    if(notDeclared)
    {
        if(!fElemNonDeclPool)
            fElemNonDeclPool = new (fMemoryManager) RefHash3KeysIdPool<SchemaElementDecl>(29, true, 128, fMemoryManager);
        retVal->setId(fElemNonDeclPool->put((void*)retVal->getBaseName(), uriId, scope, retVal));
    } else
    {
        retVal->setId(fElemDeclPool->put((void*)retVal->getBaseName(), uriId, scope, retVal));
    }
    return retVal;
}